

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O3

void __thiscall icu_63::DecomposeNormalizer2::~DecomposeNormalizer2(DecomposeNormalizer2 *this)

{
  void *in_RSI;
  
  UObject::~UObject((UObject *)this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

void
Normalizer2::normalizeUTF8(uint32_t /*options*/, StringPiece src, ByteSink &sink,
                           Edits *edits, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return;
    }
    if (edits != nullptr) {
        errorCode = U_UNSUPPORTED_ERROR;
        return;
    }
    UnicodeString src16 = UnicodeString::fromUTF8(src);
    normalize(src16, errorCode).toUTF8(sink);
}